

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_EvalFunctionInternal
                  (JSContext *ctx,JSValue fun_obj,JSValue this_obj,JSVarRef **var_refs,
                  JSStackFrame *sf)

{
  JSValue v;
  JSValue func_obj;
  JSValue bfunc;
  JSValue JVar1;
  int iVar2;
  JSContext *in_RCX;
  int in_EDX;
  int64_t in_RSI;
  JSContext *in_RDI;
  JSValueUnion in_R8;
  JSStackFrame *in_R9;
  JSValue JVar3;
  JSModuleDef *in_stack_00000018;
  JSContext *in_stack_00000020;
  JSModuleDef *m;
  uint32_t tag;
  JSValue ret_val;
  JSContext *in_stack_ffffffffffffff60;
  JSValueUnion JVar4;
  undefined4 in_stack_ffffffffffffff68;
  JSFreeModuleEnum in_stack_ffffffffffffff6c;
  JSValueUnion in_stack_ffffffffffffff70;
  JSContext *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff88 [16];
  undefined1 auVar5 [12];
  undefined4 in_stack_ffffffffffffffa8;
  int64_t in_stack_ffffffffffffffb0;
  int64_t local_48;
  int32_t local_10;
  undefined4 uStack_c;
  int64_t local_8;
  
  auVar5 = in_stack_ffffffffffffff88._4_12_;
  if (in_EDX == -2) {
    bfunc.tag = in_RSI;
    bfunc.u.float64 = in_R8.float64;
    JVar3 = js_closure(in_RCX,bfunc,(JSVarRef **)in_RDI,in_R9);
    func_obj.u._4_4_ = in_EDX;
    func_obj.u.int32 = in_stack_ffffffffffffffa8;
    func_obj.tag = in_stack_ffffffffffffffb0;
    JVar3 = JS_CallFree(auVar5._4_8_,func_obj,JVar3,auVar5._0_4_,(JSValue *)in_RCX);
    JVar4 = JVar3.u;
    local_48 = JVar3.tag;
  }
  else {
    if (in_EDX == -3) {
      JVar3.u._4_4_ = in_stack_ffffffffffffff6c;
      JVar3.u.int32 = in_stack_ffffffffffffff68;
      JVar3.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
      JS_FreeValue(in_stack_ffffffffffffff60,JVar3);
      iVar2 = js_create_module_function
                        (in_stack_ffffffffffffff78,(JSModuleDef *)in_stack_ffffffffffffff70.ptr);
      if ((-1 < iVar2) &&
         (iVar2 = js_link_module((JSContext *)var_refs,(JSModuleDef *)ret_val.tag), -1 < iVar2)) {
        JVar3 = js_evaluate_module(in_stack_00000020,in_stack_00000018);
        in_stack_ffffffffffffff70 = JVar3.u;
        local_48 = JVar3.tag;
        JVar4 = in_stack_ffffffffffffff70;
        iVar2 = JS_IsException(JVar3);
        if (iVar2 == 0) goto LAB_00143ce7;
      }
      js_free_modules((JSContext *)in_stack_ffffffffffffff70.ptr,in_stack_ffffffffffffff6c);
      local_10 = 0;
      local_8 = 6;
      goto LAB_00143d01;
    }
    v.u._4_4_ = in_stack_ffffffffffffff6c;
    v.u.int32 = in_stack_ffffffffffffff68;
    v.tag = (int64_t)in_stack_ffffffffffffff70.ptr;
    JS_FreeValue(in_stack_ffffffffffffff60,v);
    JVar3 = JS_ThrowTypeError(in_RDI,"bytecode function expected");
    JVar4 = JVar3.u;
    local_48 = JVar3.tag;
  }
LAB_00143ce7:
  local_10 = JVar4.int32;
  uStack_c = JVar4._4_4_;
  local_8 = local_48;
LAB_00143d01:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = local_8;
  return JVar1;
}

Assistant:

static JSValue JS_EvalFunctionInternal(JSContext *ctx, JSValue fun_obj,
                                       JSValueConst this_obj,
                                       JSVarRef **var_refs, JSStackFrame *sf)
{
    JSValue ret_val;
    uint32_t tag;

    tag = JS_VALUE_GET_TAG(fun_obj);
    if (tag == JS_TAG_FUNCTION_BYTECODE) {
        fun_obj = js_closure(ctx, fun_obj, var_refs, sf);
        ret_val = JS_CallFree(ctx, fun_obj, this_obj, 0, NULL);
    } else if (tag == JS_TAG_MODULE) {
        JSModuleDef *m;
        m = JS_VALUE_GET_PTR(fun_obj);
        /* the module refcount should be >= 2 */
        JS_FreeValue(ctx, fun_obj);
        if (js_create_module_function(ctx, m) < 0)
            goto fail;
        if (js_link_module(ctx, m) < 0)
            goto fail;
        ret_val = js_evaluate_module(ctx, m);
        if (JS_IsException(ret_val)) {
        fail:
            js_free_modules(ctx, JS_FREE_MODULE_NOT_EVALUATED);
            return JS_EXCEPTION;
        }
    } else {
        JS_FreeValue(ctx, fun_obj);
        ret_val = JS_ThrowTypeError(ctx, "bytecode function expected");
    }
    return ret_val;
}